

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O3

void __thiscall
Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Vector3f *p,Vector3f *q,
                  Vector3f *r,Material *m)

{
  int iVar1;
  long lVar2;
  float fVar3;
  Vector3f local_64;
  Vector3f *local_58;
  Vector3f *local_50;
  Vector3f local_48;
  Vector3f local_3c;
  
  (this->super_Object).remit = 0;
  lVar2 = 0x1c;
  (this->super_Object).m = m;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_intersect_001f6aa8;
  this->empty = false;
  this->has_uv = false;
  local_58 = p;
  local_50 = q;
  do {
    Vector2f::Vector2f((Vector2f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x34);
  lVar2 = 0x38;
  do {
    Vector3f::Vector3f((Vector3f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x5c);
  lVar2 = 0x5c;
  do {
    Vector3f::Vector3f((Vector3f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x80);
  Vector3f::Vector3f(&this->o,0.0);
  Matrix3f::Matrix3f(&this->matrix,0.0);
  Vector3f::operator=((Vector3f *)&this->field_0x5c,a);
  Vector3f::operator=((Vector3f *)&this->field_0x68,b);
  Vector3f::operator=((Vector3f *)&this->field_0x74,c);
  operator-(a,b);
  operator-(a,c);
  Vector3f::cross(&local_3c,&local_48);
  fVar3 = Vector3f::length(&local_64);
  fVar3 = fVar3 * 0.5;
  this->area = fVar3;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    Vector3f::normalized(local_58);
    Vector3f::operator=((Vector3f *)&this->field_0x38,&local_64);
    Vector3f::normalized(local_50);
    Vector3f::operator=((Vector3f *)&this->field_0x44,&local_64);
    Vector3f::normalized(r);
    Vector3f::operator=((Vector3f *)&this->field_0x50,&local_64);
    this->use_n = true;
    iVar1 = (*m->_vptr_Material[4])(m);
    if (((char)iVar1 != '\0') && (*(char *)&m[0x28]._vptr_Material == '\0')) {
      (this->super_Object).remit = 1;
    }
    iVar1 = (*m->_vptr_Material[2])(m);
    if ((char)iVar1 != '\0') {
      prepare_coords(this);
    }
  }
  else {
    this->empty = true;
  }
  return;
}

Assistant:

Triangle(const Vector3f& a, const Vector3f& b, const Vector3f& c,
		const Vector3f& p, const Vector3f& q, const Vector3f& r, Material* m) :Object(m) {
		v[0] = a;
		v[1] = b;
		v[2] = c;
		area = Vector3f::cross(a - b, a - c).length() / 2;
		if (area == 0)
		{
			empty = true;
			return;
		}
		n[0] = p.normalized();
		n[1] = q.normalized();
		n[2] = r.normalized();
		use_n = true;
#ifdef TRIANGLE_REMIT
		if (m->is_brdf() && !((BRDFMaterial*)m)->emissionColor.is_empty())
			remit = 1;
#endif
		if (m->need_coords()) prepare_coords();
	}